

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int closeFileHandleList(FileHandle **list)

{
  PHYSFS_Io *pPVar1;
  __PHYSFS_FILEHANDLE__ *p_Var2;
  int in_EAX;
  FileHandle *pFVar3;
  
  pFVar3 = *list;
  while (pFVar3 != (FileHandle *)0x0) {
    pPVar1 = pFVar3->io;
    p_Var2 = pFVar3->next;
    if (pPVar1->flush != (_func_int_PHYSFS_Io_ptr *)0x0) {
      in_EAX = (*pPVar1->flush)(pPVar1);
      if (in_EAX == 0) break;
    }
    (*pPVar1->destroy)(pPVar1);
    in_EAX = (*__PHYSFS_AllocatorHooks.Free)(pFVar3);
    pFVar3 = p_Var2;
  }
  *list = pFVar3;
  return in_EAX;
}

Assistant:

static int closeFileHandleList(FileHandle **list)
{
    FileHandle *i;
    FileHandle *next = NULL;

    for (i = *list; i != NULL; i = next)
    {
        PHYSFS_Io *io = i->io;
        next = i->next;

        if (io->flush && !io->flush(io))
        {
            *list = i;
            return 0;
        } /* if */

        io->destroy(io);
        allocator.Free(i);
    } /* for */

    *list = NULL;
    return 1;
}